

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_is_subset(run_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar3 = container1->n_runs;
  if (iVar3 < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar5 = 0;
    do {
      if (container2->n_runs <= iVar5) break;
      uVar1 = container1->runs[iVar4].value;
      uVar2 = container2->runs[iVar5].value;
      if (uVar1 < uVar2) {
        return false;
      }
      uVar6 = (uint)container1->runs[iVar4].length + (uint)uVar1;
      uVar7 = (uint)container2->runs[iVar5].length + (uint)uVar2;
      if (uVar6 < uVar7) {
        iVar4 = iVar4 + 1;
      }
      else {
        if (uVar6 == uVar7) {
          iVar4 = iVar4 + 1;
        }
        iVar5 = iVar5 + 1;
      }
    } while (iVar4 < iVar3);
  }
  return iVar4 == iVar3;
}

Assistant:

bool run_container_is_subset(const run_container_t *container1,
                             const run_container_t *container2) {
    int i1 = 0, i2 = 0;
    while (i1 < container1->n_runs && i2 < container2->n_runs) {
        int start1 = container1->runs[i1].value;
        int stop1 = start1 + container1->runs[i1].length;
        int start2 = container2->runs[i2].value;
        int stop2 = start2 + container2->runs[i2].length;
        if (start1 < start2) {
            return false;
        } else {  // start1 >= start2
            if (stop1 < stop2) {
                i1++;
            } else if (stop1 == stop2) {
                i1++;
                i2++;
            } else {  // stop1 > stop2
                i2++;
            }
        }
    }
    if (i1 == container1->n_runs) {
        return true;
    } else {
        return false;
    }
}